

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int cert_crl(X509_STORE_CTX *ctx,X509_CRL *crl,X509 *x)

{
  int iVar1;
  X509_REVOKED *local_30;
  X509_REVOKED *rev;
  X509 *x_local;
  X509_CRL *crl_local;
  X509_STORE_CTX *ctx_local;
  
  rev = (X509_REVOKED *)x;
  x_local = (X509 *)crl;
  crl_local = (X509_CRL *)ctx;
  if (((ctx->param->flags & 0x10) == 0) && ((crl->flags & 0x200U) != 0)) {
    ctx->error = 0x24;
    iVar1 = call_verify_cb(0,ctx);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = X509_CRL_get0_by_cert((X509_CRL *)x_local,&local_30,(X509 *)rev);
  if (iVar1 != 0) {
    crl_local->crl_hash[0x18] = '\x17';
    crl_local->crl_hash[0x19] = '\0';
    crl_local->crl_hash[0x1a] = '\0';
    crl_local->crl_hash[0x1b] = '\0';
    iVar1 = call_verify_cb(0,(X509_STORE_CTX *)crl_local);
    if (iVar1 == 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int cert_crl(X509_STORE_CTX *ctx, X509_CRL *crl, X509 *x) {
  // The rules changed for this... previously if a CRL contained unhandled
  // critical extensions it could still be used to indicate a certificate
  // was revoked. This has since been changed since critical extension can
  // change the meaning of CRL entries.
  if (!(ctx->param->flags & X509_V_FLAG_IGNORE_CRITICAL) &&
      (crl->flags & EXFLAG_CRITICAL)) {
    ctx->error = X509_V_ERR_UNHANDLED_CRITICAL_CRL_EXTENSION;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }
  // Look for serial number of certificate in CRL.
  X509_REVOKED *rev;
  if (X509_CRL_get0_by_cert(crl, &rev, x)) {
    ctx->error = X509_V_ERR_CERT_REVOKED;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  return 1;
}